

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveFile::CDirectiveFile(CDirectiveFile *this,Type type,ArgumentList *args)

{
  bool bVar1;
  Entry *pEVar2;
  GenericAssemblerFile *pGVar3;
  wstring local_f8 [32];
  wstring local_d8 [32];
  wstring local_b8 [32];
  undefined4 local_98;
  wstring local_88 [36];
  u32 local_64;
  wstring local_60 [4];
  int virtualAddress;
  wstring fileName;
  wstring local_40 [8];
  wstring originalName;
  ArgumentList *args_local;
  Type type_local;
  CDirectiveFile *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveFile_001f2b60;
  this->type = type;
  this->file = (GenericAssemblerFile *)0x0;
  std::__cxx11::wstring::wstring(local_40);
  std::__cxx11::wstring::wstring(local_60);
  switch(type) {
  case Open:
    ArgumentList::operator[](args,0);
    getFullPathName(local_88);
    std::__cxx11::wstring::operator=(local_60,(wstring *)local_88);
    std::__cxx11::wstring::~wstring((wstring *)local_88);
    bVar1 = fileExists((wstring *)local_60);
    if (!bVar1) {
      Logger::printError<std::__cxx11::wstring>
                (FatalError,L"File %s not found",
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_60);
      local_98 = 1;
      goto LAB_0019987b;
    }
    pEVar2 = ArgumentList::operator[](args,1);
    bVar1 = ConvertExpression(&pEVar2->text,(int *)&local_64);
    if (!bVar1) {
      pEVar2 = ArgumentList::operator[](args,1);
      Logger::printError<std::__cxx11::wstring>(FatalError,L"Invalid ram address %s",&pEVar2->text);
      local_98 = 1;
      goto LAB_0019987b;
    }
    pGVar3 = (GenericAssemblerFile *)operator_new(0xa0);
    GenericAssemblerFile::GenericAssemblerFile(pGVar3,(wstring *)local_60,local_64,false);
    this->file = pGVar3;
    break;
  case Create:
    ArgumentList::operator[](args,0);
    getFullPathName(local_b8);
    std::__cxx11::wstring::operator=(local_60,(wstring *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_b8);
    pEVar2 = ArgumentList::operator[](args,1);
    bVar1 = ConvertExpression(&pEVar2->text,(int *)&local_64);
    if (!bVar1) {
      pEVar2 = ArgumentList::operator[](args,1);
      Logger::printError<std::__cxx11::wstring>(FatalError,L"Invalid ram address %s",&pEVar2->text);
      local_98 = 1;
      goto LAB_0019987b;
    }
    pGVar3 = (GenericAssemblerFile *)operator_new(0xa0);
    GenericAssemblerFile::GenericAssemblerFile(pGVar3,(wstring *)local_60,local_64,true);
    this->file = pGVar3;
    break;
  case Copy:
    ArgumentList::operator[](args,0);
    getFullPathName(local_d8);
    std::__cxx11::wstring::operator=(local_40,(wstring *)local_d8);
    std::__cxx11::wstring::~wstring((wstring *)local_d8);
    ArgumentList::operator[](args,1);
    getFullPathName(local_f8);
    std::__cxx11::wstring::operator=(local_60,(wstring *)local_f8);
    std::__cxx11::wstring::~wstring((wstring *)local_f8);
    bVar1 = fileExists((wstring *)local_40);
    if (!bVar1) {
      Logger::printError<std::__cxx11::wstring>
                (FatalError,L"File %s not found",
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_40);
      local_98 = 1;
      goto LAB_0019987b;
    }
    pEVar2 = ArgumentList::operator[](args,2);
    bVar1 = ConvertExpression(&pEVar2->text,(int *)&local_64);
    if (!bVar1) {
      pEVar2 = ArgumentList::operator[](args,2);
      Logger::printError<std::__cxx11::wstring>(FatalError,L"Invalid ram address %s",&pEVar2->text);
      local_98 = 1;
      goto LAB_0019987b;
    }
    pGVar3 = (GenericAssemblerFile *)operator_new(0xa0);
    GenericAssemblerFile::GenericAssemblerFile
              (pGVar3,(wstring *)local_60,(wstring *)local_40,local_64);
    this->file = pGVar3;
    break;
  case Close:
    local_98 = 1;
    goto LAB_0019987b;
  }
  FileManager::addFile(g_fileManager,&this->file->super_AssemblerFile);
  Global.Section = Global.Section + 1;
  local_98 = 0;
LAB_0019987b:
  std::__cxx11::wstring::~wstring(local_60);
  std::__cxx11::wstring::~wstring(local_40);
  return;
}

Assistant:

CDirectiveFile::CDirectiveFile(Type type, ArgumentList& args)
	: type(type)
{
	file = NULL;
	
	std::wstring originalName;
	std::wstring fileName;
	int virtualAddress;

	switch (type)
	{
	case Type::Open:
		fileName = getFullPathName(args[0].text);

		if (fileExists(fileName) == false)
		{
			Logger::printError(Logger::FatalError,L"File %s not found",fileName);
			return;
		}
		if (ConvertExpression(args[1].text,virtualAddress) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid ram address %s",args[1].text);
			return;
		}

		file = new GenericAssemblerFile(fileName,virtualAddress,false);
		break;
	case Type::Create:
		fileName = getFullPathName(args[0].text);

		if (ConvertExpression(args[1].text,virtualAddress) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid ram address %s",args[1].text);
			return;
		}

		file = new GenericAssemblerFile(fileName,virtualAddress,true);
		break;
	case Type::Copy:
		originalName = getFullPathName(args[0].text);
		fileName = getFullPathName(args[1].text);

		if (fileExists(originalName) == false)
		{
			Logger::printError(Logger::FatalError,L"File %s not found",originalName);
			return;
		}
		if (ConvertExpression(args[2].text,virtualAddress) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid ram address %s",args[2].text);
			return;
		}

		file = new GenericAssemblerFile(fileName,originalName,virtualAddress);
		break;
	case Type::Close:
		return;
	}

	g_fileManager->addFile(file);
	Global.Section++;
}